

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O2

void __thiscall
CUI::DoScrollbarOptionLabeled
          (CUI *this,void *pID,int *pOption,CUIRect *pRect,char *pStr,char **aLabels,int NumLabels,
          IScrollbarScale *pScale)

{
  float fVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long in_FS_OFFSET;
  float Current;
  CUIRect ScrollBar;
  CUIRect Label;
  char aBuf [128];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = *pOption;
  uVar6 = NumLabels - 1;
  uVar5 = uVar6;
  if ((int)uVar4 < (int)uVar6) {
    uVar5 = uVar4;
  }
  if ((int)uVar4 < 0) {
    uVar5 = 0;
  }
  str_format(aBuf,0x80,"%s: %s",pStr,aLabels[(int)uVar5]);
  fVar1 = pRect->h;
  Label.x = 0.0;
  Label.y = 0.0;
  Label.w = 0.0;
  Label.h = 0.25;
  CUIRect::Draw(pRect,(vec4 *)&Label,5.0,0xf);
  CUIRect::VSplitLeft(pRect,pRect->h + 5.0,(CUIRect *)0x0,&Label);
  CUIRect::VSplitRight(&Label,60.0,&Label,&ScrollBar);
  DoLabel(this,&Label,aBuf,fVar1 * 0.8 * 0.8,4,-1.0,true);
  CUIRect::VMargin(&ScrollBar,4.0,&ScrollBar);
  (**pScale->_vptr_IScrollbarScale)(pScale,(ulong)uVar5,0,(ulong)uVar6);
  DoScrollbarH(this,pID,&ScrollBar,Current);
  uVar4 = (*pScale->_vptr_IScrollbarScale[1])(pScale,0,(ulong)uVar6);
  if (this->m_pHotItem != pID) {
    if (this->m_pActiveItem == pID) {
      this->m_ActiveItemValid = true;
    }
    else {
      bVar3 = MouseHovered(this,pRect);
      if (((bVar3) && ((this->m_MouseButtons & 1) != 0)) && ((this->m_LastMouseButtons & 1) == 0)) {
        uVar4 = (int)(uVar4 + 1) % NumLabels;
      }
    }
  }
  if ((int)uVar4 < (int)uVar6) {
    uVar6 = uVar4;
  }
  if ((int)uVar4 < 0) {
    uVar6 = 0;
  }
  *pOption = uVar6;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CUI::DoScrollbarOptionLabeled(const void *pID, int *pOption, const CUIRect *pRect, const char *pStr, const char* aLabels[], int NumLabels, const IScrollbarScale *pScale)
{
	int Value = clamp(*pOption, 0, NumLabels - 1);
	const int Max = NumLabels - 1;

	char aBuf[128];
	str_format(aBuf, sizeof(aBuf), "%s: %s", pStr, aLabels[Value]);

	float FontSize = pRect->h*CUI::ms_FontmodHeight*0.8f;

	pRect->Draw(vec4(0.0f, 0.0f, 0.0f, 0.25f));

	CUIRect Label, ScrollBar;
	pRect->VSplitLeft(pRect->h+5.0f, 0, &Label);
	Label.VSplitRight(60.0f, &Label, &ScrollBar);
	DoLabel(&Label, aBuf, FontSize, TEXTALIGN_ML);

	ScrollBar.VMargin(4.0f, &ScrollBar);
	Value = pScale->ToAbsolute(DoScrollbarH(pID, &ScrollBar, pScale->ToRelative(Value, 0, Max)), 0, Max);

	if(HotItem() != pID && !CheckActiveItem(pID) && MouseHovered(pRect) && MouseButtonClicked(0))
		Value = (Value + 1) % NumLabels;

	*pOption = clamp(Value, 0, Max);
}